

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v9::detail::write_codepoint<2ul,char,fmt::v9::detail::counting_iterator>
          (counting_iterator out,char prefix,uint32_t cp)

{
  counting_iterator cVar1;
  counting_iterator end;
  uint in_EDX;
  char in_SIL;
  char buf [2];
  counting_iterator *in_stack_ffffffffffffffb8;
  char local_3b [2];
  char in_stack_ffffffffffffffc7;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  value_type local_1a;
  char local_19;
  uint local_18;
  char local_11;
  
  local_19 = '\\';
  local_18 = in_EDX;
  local_11 = in_SIL;
  cVar1 = counting_iterator::operator++(in_stack_ffffffffffffffb8,0);
  counting_iterator::operator*((counting_iterator *)&stack0xffffffffffffffd8);
  counting_iterator::value_type::operator=(&local_1a,&local_19);
  end = counting_iterator::operator++(in_stack_ffffffffffffffb8,0);
  counting_iterator::operator*((counting_iterator *)&stack0xffffffffffffffc8);
  counting_iterator::value_type::operator=
            ((value_type *)&stack0xffffffffffffffd5,&stack0xffffffffffffffd6);
  fill_n<char,unsigned_long>
            ((char *)CONCAT17(in_stack_ffffffffffffffd7,CONCAT16(local_11,in_stack_ffffffffffffffd0)
                             ),end.count_,in_stack_ffffffffffffffc7);
  format_uint<4u,char,unsigned_int>(local_3b,local_18,2,false);
  cVar1 = copy_str<char,char*,fmt::v9::detail::counting_iterator>
                    ((char *)CONCAT17(in_stack_ffffffffffffffd7,
                                      CONCAT16(local_11,in_stack_ffffffffffffffd0)),end.count_,cVar1
                    );
  return (counting_iterator)cVar1.count_;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}